

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZoneCache::set_local_zone(CVmTimeZoneCache *this,char *name)

{
  size_t sVar1;
  void *pvVar2;
  CVmTimeZone *in_RSI;
  long in_RDI;
  size_t len;
  
  if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 8));
  }
  sVar1 = strlen((char *)in_RSI);
  pvVar2 = operator_new__(sVar1 + 1);
  *(void **)(in_RDI + 8) = pvVar2;
  memcpy(*(void **)(in_RDI + 8),in_RSI,sVar1 + 1);
  if (*(long *)(in_RDI + 0x10) != 0) {
    pvVar2 = *(void **)(in_RDI + 0x10);
    if (pvVar2 != (void *)0x0) {
      CVmTimeZone::~CVmTimeZone(in_RSI);
      operator_delete(pvVar2,0x68);
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

void CVmTimeZoneCache::set_local_zone(const char *name)
{
    /* delete any existing name */
    if (local_zone_name_ != 0)
        delete [] local_zone_name_;

    /* save a copy of the new name */
    size_t len = strlen(name) + 1;
    local_zone_name_ = new char[len];
    memcpy(local_zone_name_, name, len);

    /* if we've previously loaded a local zone, delete it */
    if (local_zone_ != 0)
    {
        delete local_zone_;
        local_zone_ = 0;
    }
}